

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *this_00;
  pointer pMVar1;
  string *this_01;
  XmlWriter *this_02;
  AssertionResult *this_03;
  AssertionStats *pAVar2;
  int iVar3;
  OfType OVar4;
  undefined4 uVar5;
  undefined8 extraout_RDX;
  XmlReporter *this_04;
  MessageInfo *msg;
  pointer pMVar6;
  long in_FS_OFFSET;
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  XmlWriter *local_d0;
  undefined4 local_c4;
  XmlReporter *local_c0;
  AssertionResult *local_b8;
  AssertionStats *local_b0;
  StringRef local_a8;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  string local_58;
  ostream *local_38;
  
  local_38 = *(ostream **)(in_FS_OFFSET + 0x28);
  iVar3 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  uVar5 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  if (((char)iVar3 == '\0') &&
     ((OVar4 = (assertionStats->assertionResult).m_resultData.resultType, (OVar4 & FailureBit) == Ok
      || (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    if (OVar4 != Warning) goto LAB_0018931d;
    uVar5 = 0;
  }
  local_b8 = &assertionStats->assertionResult;
  pMVar1 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_d0 = &this->m_xml;
  this_01 = (string *)&((XmlWriter *)local_78)->m_indent;
  this_00 = (XmlWriter *)(local_98 + 0x20);
  local_c4 = uVar5;
  local_c0 = this;
  local_b0 = assertionStats;
  for (pMVar6 = (assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start; pAVar2 = local_b0, this_02 = local_d0,
      pMVar6 != pMVar1; pMVar6 = pMVar6 + 1) {
    if (pMVar6->type == Info && (char)uVar5 == '\x01') {
      std::__cxx11::string::string(this_01,"Info",(allocator *)local_98);
      XmlWriter::scopedElement(this_00,(string *)local_d0,(XmlFormatting)this_01);
      XmlWriter::writeText((XmlWriter *)local_78._0_8_,&pMVar6->message,Newline|Indent);
LAB_00188ee2:
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)this_00);
      std::__cxx11::string::~string(this_01);
    }
    else if (pMVar6->type == Warning) {
      std::__cxx11::string::string(this_01,"Warning",(allocator *)local_98);
      XmlWriter::scopedElement(this_00,(string *)local_d0,(XmlFormatting)this_01);
      XmlWriter::writeText((XmlWriter *)local_78._0_8_,&pMVar6->message,Newline|Indent);
      goto LAB_00188ee2;
    }
  }
  OVar4 = (local_b0->assertionResult).m_resultData.resultType;
  if ((byte)((byte)local_c4 | OVar4 == Warning) != 1) goto LAB_0018931d;
  this_04 = local_c0;
  if ((local_b0->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::__cxx11::string::string
              ((string *)&((XmlWriter *)local_78)->m_indent,"Expression",&local_d1);
    this_04 = local_c0;
    XmlWriter::startElement(this_02,&((XmlWriter *)local_78)->m_indent,Newline|Indent);
    std::__cxx11::string::string((string *)(local_98 + 0x20),"success",&local_d2);
    XmlWriter::writeAttribute
              (this_02,(string *)(local_98 + 0x20),
               ((pAVar2->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    std::__cxx11::string::string((string *)local_98,"type",&local_d3);
    local_a8.m_start = (pAVar2->assertionResult).m_info.macroName.m_start;
    local_a8.m_size = (pAVar2->assertionResult).m_info.macroName.m_size;
    XmlWriter::writeAttribute<Catch::StringRef>(this_02,(string *)local_98,&local_a8);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)(local_98 + 0x20));
    std::__cxx11::string::~string((string *)&((XmlWriter *)local_78)->m_indent);
    local_58._M_dataplus._M_p = (pAVar2->assertionResult).m_info.lineInfo.file;
    local_58._M_string_length = (pAVar2->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_04,(SourceLineInfo *)&((XmlWriter *)local_78)->m_indent);
    std::__cxx11::string::string
              ((string *)&((XmlWriter *)local_78)->m_indent,"Original",(allocator *)&local_a8);
    XmlWriter::scopedElement
              ((XmlWriter *)local_98,(string *)this_02,(int)(XmlWriter *)local_78 + 0x20);
    this_03 = local_b8;
    AssertionResult::getExpression_abi_cxx11_((string *)(local_98 + 0x20),local_b8);
    XmlWriter::writeText((XmlWriter *)local_98._0_8_,(string *)(local_98 + 0x20),Newline|Indent);
    std::__cxx11::string::~string((string *)(local_98 + 0x20));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
    std::__cxx11::string::~string((string *)&((XmlWriter *)local_78)->m_indent);
    std::__cxx11::string::string
              ((string *)&((XmlWriter *)local_78)->m_indent,"Expanded",(allocator *)&local_a8);
    XmlWriter::scopedElement
              ((XmlWriter *)local_98,(string *)this_02,(int)(XmlWriter *)local_78 + 0x20);
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)(local_98 + 0x20),this_03);
    XmlWriter::writeText((XmlWriter *)local_98._0_8_,(string *)(local_98 + 0x20),Newline|Indent);
    std::__cxx11::string::~string((string *)(local_98 + 0x20));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
    std::__cxx11::string::~string((string *)&((XmlWriter *)local_78)->m_indent);
    OVar4 = (pAVar2->assertionResult).m_resultData.resultType;
  }
  if (OVar4 == Info) {
    std::__cxx11::string::string
              ((string *)&((XmlWriter *)local_78)->m_indent,"Info",(allocator *)&local_a8);
    XmlWriter::scopedElement
              ((XmlWriter *)local_98,(string *)this_02,(int)(XmlWriter *)local_78 + 0x20);
    std::__cxx11::string::string
              ((string *)(local_98 + 0x20),(string *)&(pAVar2->assertionResult).m_resultData);
    XmlWriter::writeText((XmlWriter *)local_98._0_8_,(string *)(local_98 + 0x20),Newline|Indent);
    std::__cxx11::string::~string((string *)(local_98 + 0x20));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
    std::__cxx11::string::~string((string *)&((XmlWriter *)local_78)->m_indent);
  }
  else {
    if (OVar4 == ExplicitFailure) {
      std::__cxx11::string::string
                ((string *)&((XmlWriter *)local_78)->m_indent,"Failure",
                 (allocator *)(local_98 + 0x20));
      XmlWriter::startElement(this_02,&((XmlWriter *)local_78)->m_indent,Newline|Indent);
      std::__cxx11::string::~string((string *)&((XmlWriter *)local_78)->m_indent);
      local_58._M_dataplus._M_p = (pAVar2->assertionResult).m_info.lineInfo.file;
      local_58._M_string_length = (pAVar2->assertionResult).m_info.lineInfo.line;
      writeSourceInfo(this_04,(SourceLineInfo *)&((XmlWriter *)local_78)->m_indent);
      std::__cxx11::string::string
                ((string *)&((XmlWriter *)local_78)->m_indent,
                 (string *)&(pAVar2->assertionResult).m_resultData);
      XmlWriter::writeText(this_02,&((XmlWriter *)local_78)->m_indent,Newline|Indent);
    }
    else if (OVar4 == FatalErrorCondition) {
      std::__cxx11::string::string
                ((string *)&((XmlWriter *)local_78)->m_indent,"FatalErrorCondition",
                 (allocator *)(local_98 + 0x20));
      XmlWriter::startElement(this_02,&((XmlWriter *)local_78)->m_indent,Newline|Indent);
      std::__cxx11::string::~string((string *)&((XmlWriter *)local_78)->m_indent);
      local_58._M_dataplus._M_p = (pAVar2->assertionResult).m_info.lineInfo.file;
      local_58._M_string_length = (pAVar2->assertionResult).m_info.lineInfo.line;
      writeSourceInfo(this_04,(SourceLineInfo *)&((XmlWriter *)local_78)->m_indent);
      std::__cxx11::string::string
                ((string *)&((XmlWriter *)local_78)->m_indent,
                 (string *)&(pAVar2->assertionResult).m_resultData);
      XmlWriter::writeText(this_02,&((XmlWriter *)local_78)->m_indent,Newline|Indent);
    }
    else {
      if (OVar4 != ThrewException) goto LAB_0018930b;
      std::__cxx11::string::string
                ((string *)&((XmlWriter *)local_78)->m_indent,"Exception",
                 (allocator *)(local_98 + 0x20));
      XmlWriter::startElement(this_02,&((XmlWriter *)local_78)->m_indent,Newline|Indent);
      std::__cxx11::string::~string((string *)&((XmlWriter *)local_78)->m_indent);
      local_58._M_dataplus._M_p = (pAVar2->assertionResult).m_info.lineInfo.file;
      local_58._M_string_length = (pAVar2->assertionResult).m_info.lineInfo.line;
      writeSourceInfo(this_04,(SourceLineInfo *)&((XmlWriter *)local_78)->m_indent);
      std::__cxx11::string::string
                ((string *)&((XmlWriter *)local_78)->m_indent,
                 (string *)&(pAVar2->assertionResult).m_resultData);
      XmlWriter::writeText(this_02,&((XmlWriter *)local_78)->m_indent,Newline|Indent);
    }
    std::__cxx11::string::~string((string *)&((XmlWriter *)local_78)->m_indent);
    XmlWriter::endElement(this_02,Newline|Indent);
  }
LAB_0018930b:
  if ((pAVar2->assertionResult).m_info.capturedExpression.m_size != 0) {
    XmlWriter::endElement(this_02,Newline|Indent);
  }
LAB_0018931d:
  if (*(ostream **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }